

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

Vector3f __thiscall BRDFMaterial::BRDF(BRDFMaterial *this,Vector3f *in,Vector3f *out,Hit *hit)

{
  Vector3f *this_00;
  float fVar1;
  float fVar2;
  long in_R8;
  Vector2f *rv;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  Vector3f VVar12;
  Vector3f VVar13;
  Vector3f V;
  Vector3f N;
  Vector3f L;
  Vector3f F;
  Vector3f H;
  Vector3f R;
  Vector3f local_cc;
  undefined1 local_c0 [12];
  undefined1 local_b4 [24];
  undefined1 local_9c [24];
  Vector3f local_84;
  Vector3f local_78;
  Vector2f local_6c;
  Vector2f local_64;
  Vector2f local_5c [2];
  Vector3f local_48 [2];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 extraout_var [60];
  float fVar10;
  float fVar16;
  float fVar17;
  
  Vector3f::normalized(&local_78);
  Vector3f::Vector3f(&local_84,(Vector3f *)(in_R8 + 0xc));
  auVar9._0_4_ = Vector3f::dot(&local_78,&local_84);
  auVar9._4_60_ = extraout_var;
  uVar7 = auVar9._0_8_;
  fVar10 = 0.0;
  if (0.0 < auVar9._0_4_) {
    ::operator*(auVar9._0_4_ + auVar9._0_4_,(Vector3f *)(local_9c + 0xc));
    operator-((Vector3f *)(local_9c + 0xc),&local_78);
    this_00 = (Vector3f *)(local_9c + 0xc);
    operator-(out);
    Vector3f::normalize(this_00);
    VVar12 = operator+(&local_78,this_00);
    fVar10 = VVar12.m_elements[2];
    Vector3f::normalize(local_48);
    fVar3 = Vector3f::dot(local_48,&local_84);
    fVar4 = Vector3f::dot(this_00,local_48);
    fVar5 = Vector3f::dot(this_00,&local_84);
    Vector3f::dot(&local_78,local_48);
    uVar7 = 0;
    if (0.0 <= fVar5) {
      fVar10 = fVar3 * fVar3;
      fVar1 = fVar10 * in[0x12].m_elements[0] * in[0x12].m_elements[0];
      fVar6 = expf((fVar10 + -1.0) / fVar1);
      fVar2 = 1.0 - fVar5;
      rv = (Vector2f *)(in_R8 + 0x18);
      Vector2f::Vector2f(local_5c,rv);
      Texture::get((Texture *)local_c0,(Vector2f *)(in[9].m_elements + 1));
      Vector3f::Vector3f(&local_cc,1.0);
      Vector2f::Vector2f(&local_64,rv);
      Texture::get((Texture *)local_b4,(Vector2f *)(in[9].m_elements + 1));
      operator-(&local_cc,(Vector3f *)local_b4);
      ::operator*((Vector3f *)local_9c,fVar2 * fVar2 * fVar2 * fVar2 * fVar2);
      operator+((Vector3f *)local_c0,(Vector3f *)local_9c);
      auVar8._0_4_ = (fVar3 * fVar5) / fVar4;
      auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar11._0_4_ = (fVar3 * auVar9._0_4_) / fVar4;
      auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar8 = vminss_avx(auVar11,auVar8);
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                          ZEXT416((uint)(auVar8._0_4_ + auVar8._0_4_)));
      Vector2f::Vector2f(&local_6c,rv);
      Texture::get((Texture *)local_9c,(Vector2f *)(in->m_elements + 2));
      ::operator*(auVar9._0_4_,(Vector3f *)local_c0);
      ::operator*(fVar6 / (fVar1 * fVar10),(Vector3f *)local_b4);
      ::operator*(&local_cc,auVar8._0_4_);
      operator/((Vector3f *)(local_b4 + 0xc),fVar5 * 4.0);
      VVar12 = operator+((Vector3f *)local_c0,(Vector3f *)(local_b4 + 0xc));
      VVar12.m_elements[0] = VVar12.m_elements[0];
      uVar15._4_4_ = VVar12.m_elements[1];
      register0x00001240 = VVar12.m_elements[2];
      return (Vector3f)VVar12.m_elements;
    }
  }
  Vector3f::Vector3f((Vector3f *)this,&Vector3f::ZERO);
  VVar13.m_elements[0] = (float)(int)uVar7;
  uVar14._4_4_ = (float)(int)((ulong)uVar7 >> 0x20);
  register0x00001240 = fVar10;
  return (Vector3f)VVar13.m_elements;
}

Assistant:

Vector3f BRDF(const Vector3f& in, const Vector3f& out, const Hit& hit) const {
		Vector3f L = out.normalized();
		Vector3f N = hit.norm;
		float LN = Vector3f::dot(L, N);
		if (LN <= 0) return Vector3f::ZERO;
		Vector3f R = 2 * LN * N - L, V = -in; V.normalize();
		Vector3f H = L + V; H.normalize();
		float HN = Vector3f::dot(H, N), VH = Vector3f::dot(V, H),
			VN = Vector3f::dot(V, N), LH = Vector3f::dot(L, H);
		if (VN < 0) return Vector3f::ZERO; //?
		float nhh = HN * HN;
		float D = expf((nhh - 1) / (roughness * roughness * nhh)) / (roughness * roughness * nhh * nhh);
		//		float D = roughness * roughness / (PI * td * td);
		float u = 1 - VN; //u^5
		u *= u; u *= u; u *= 1 - VN;
		Vector3f F = specularColor.get(hit.pos) + (1 - specularColor.get(hit.pos)) * u;
		float G = std::min(std::min(HN * VN / VH, HN * LN / VH) * 2, float(1));
		return LN * diffuseColor.get(hit.pos)
			+ D * F * G / (4 * VN);
	}